

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O0

int X509_alias_set1(X509 *x,uchar *name,int len)

{
  long lVar1;
  stack_st_GENERAL_NAME *psVar2;
  X509_CERT_AUX *pXVar3;
  ASN1_UTF8STRING *pAVar4;
  undefined4 in_register_00000014;
  X509_CERT_AUX *aux;
  ossl_ssize_t len_local;
  uint8_t *name_local;
  X509 *x_local;
  
  if (name == (uchar *)0x0) {
    if (((x == (X509 *)0x0) || (x->altname == (stack_st_GENERAL_NAME *)0x0)) ||
       (lVar1._0_4_ = (x->altname->stack).sorted, lVar1._4_4_ = (x->altname->stack).num_alloc,
       lVar1 == 0)) {
      x_local._4_4_ = 1;
    }
    else {
      ASN1_UTF8STRING_free(*(ASN1_UTF8STRING **)&(x->altname->stack).sorted);
      psVar2 = x->altname;
      (psVar2->stack).sorted = 0;
      (psVar2->stack).num_alloc = 0;
      x_local._4_4_ = 1;
    }
  }
  else {
    pXVar3 = aux_get((X509 *)x);
    if (pXVar3 == (X509_CERT_AUX *)0x0) {
      x_local._4_4_ = 0;
    }
    else {
      if (pXVar3->alias == (ASN1_UTF8STRING *)0x0) {
        pAVar4 = ASN1_UTF8STRING_new();
        pXVar3->alias = (ASN1_UTF8STRING *)pAVar4;
        if (pAVar4 == (ASN1_UTF8STRING *)0x0) {
          return 0;
        }
      }
      x_local._4_4_ = ASN1_STRING_set(pXVar3->alias,name,CONCAT44(in_register_00000014,len));
    }
  }
  return x_local._4_4_;
}

Assistant:

int X509_alias_set1(X509 *x, const uint8_t *name, ossl_ssize_t len) {
  X509_CERT_AUX *aux;
  // TODO(davidben): Empty aliases are not meaningful in PKCS#12, and the
  // getters cannot quite represent them. Also erase the object if |len| is
  // zero.
  if (!name) {
    if (!x || !x->aux || !x->aux->alias) {
      return 1;
    }
    ASN1_UTF8STRING_free(x->aux->alias);
    x->aux->alias = NULL;
    return 1;
  }
  if (!(aux = aux_get(x))) {
    return 0;
  }
  if (!aux->alias && !(aux->alias = ASN1_UTF8STRING_new())) {
    return 0;
  }
  return ASN1_STRING_set(aux->alias, name, len);
}